

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

wchar_t handle_name_mouse(char *buf,size_t buflen,size_t *curs,size_t *len,mouseclick mouse,
                         _Bool firsttime)

{
  int iVar1;
  char *label_list;
  menu *m_00;
  size_t sVar2;
  wchar_t action;
  menu_conflict1 *m;
  char *labels;
  wchar_t result;
  _Bool firsttime_local;
  size_t *len_local;
  size_t *curs_local;
  size_t buflen_local;
  char *buf_local;
  byte bStack_10;
  byte bStack_f;
  uint8_t uStack_e;
  mouseclick mouse_local;
  
  uStack_e = mouse.button;
  if (uStack_e == '\x02') {
    mouse_local.type = EVT_MOUSE;
  }
  else {
    labels._0_4_ = EVT_NONE;
    label_list = string_make("abcdefghijklmnopqrstuvwxyz");
    m_00 = menu_dynamic_new();
    m_00->selections = label_list;
    menu_dynamic_add_label(m_00,"Accept",'a',0,label_list);
    menu_dynamic_add_label(m_00,"Set to random name",'r',1,label_list);
    menu_dynamic_add_label(m_00,"Clear name",'c',2,label_list);
    screen_save();
    bStack_10 = mouse.x;
    bStack_f = mouse.y;
    menu_dynamic_calc_location(m_00,(uint)bStack_10,(uint)bStack_f);
    region_erase_bordered(&m_00->boundary);
    iVar1 = menu_dynamic_select(m_00);
    menu_dynamic_free(m_00);
    string_free(label_list);
    screen_load();
    if (iVar1 == 0) {
      labels._0_4_ = EVT_KBRD;
    }
    else if (iVar1 == 1) {
      sVar2 = player_random_name(buf,buflen);
      *len = sVar2;
      *curs = 0;
    }
    else if (iVar1 == 2) {
      if (buflen == 0) {
        __assert_fail("buflen > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-input.c"
                      ,0x478,
                      "int handle_name_mouse(char *, size_t, size_t *, size_t *, struct mouseclick, _Bool)"
                     );
      }
      *buf = '\0';
      *len = 0;
      *curs = 0;
    }
    mouse_local.type = (ui_event_type)labels;
  }
  return mouse_local.type;
}

Assistant:

static int handle_name_mouse(char *buf, size_t buflen, size_t *curs,
		size_t *len, struct mouseclick mouse, bool firsttime)
{
	enum { ACT_CTX_NAME_ACCEPT, ACT_CTX_NAME_RANDOM, ACT_CTX_NAME_CLEAR };
	int result = 2;
	char *labels;
	struct menu *m;
	int action;

	/*
	 * A mouse click with the second button ends the editing session and
	 * indicates that the result of editing should be rejected.
	 */
	if (mouse.button == 2) {
		return result;
	}

	/* By default, don't end the editing session. */
	result = 0;

	/* Present a context menu with the possible actions. */
	labels = string_make(lower_case);
	m = menu_dynamic_new();

	m->selections = labels;
	menu_dynamic_add_label(m, "Accept", 'a', ACT_CTX_NAME_ACCEPT, labels);
	menu_dynamic_add_label(m, "Set to random name", 'r',
		ACT_CTX_NAME_RANDOM, labels);
	menu_dynamic_add_label(m, "Clear name", 'c', ACT_CTX_NAME_CLEAR,
		labels);

	screen_save();

	menu_dynamic_calc_location(m, mouse.x, mouse.y);
	region_erase_bordered(&m->boundary);

	action = menu_dynamic_select(m);

	menu_dynamic_free(m);
	string_free(labels);

	screen_load();

	/* Do what was requested. */
	switch (action) {
	case ACT_CTX_NAME_ACCEPT:
		/* End the editing session and accept the result. */
		result = 1;
		break;

	case ACT_CTX_NAME_RANDOM:
		*len = player_random_name(buf, buflen);
		*curs = 0;
		break;

	case ACT_CTX_NAME_CLEAR:
		assert(buflen > 0);
		buf[0] = '\0';
		*len = 0;
		*curs = 0;
		break;
	}

	return result;
}